

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O3

void __thiscall
Assimp::OptimizeGraphProcess::CollectNewChildren
          (OptimizeGraphProcess *this,aiNode *nd,list<aiNode_*,_std::allocator<aiNode_*>_> *nodes)

{
  char *pcVar1;
  undefined1 (*pauVar2) [16];
  long *******ppppppplVar3;
  aiNode *paVar4;
  aiMesh *pMesh;
  aiVector3D *paVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [16];
  pointer pcVar26;
  undefined1 auVar27 [8];
  int iVar28;
  aiNode **tmp;
  size_t sVar29;
  iterator iVar30;
  _List_node_base *p_Var31;
  _List_node_base *p_Var32;
  long *******ppppppplVar33;
  iterator iVar34;
  aiNode **ppaVar35;
  ulong uVar36;
  _List_node_base *p_Var37;
  _List_node_base *p_Var38;
  uint uVar39;
  long lVar40;
  _Node_conflict1 *__tmp;
  long *******ppppppplVar41;
  int iVar42;
  ulong uVar43;
  size_t sVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  list<aiNode_*,_std::allocator<aiNode_*>_> child_nodes;
  aiMatrix4x4 inv;
  list<aiNode_*,_std::allocator<aiNode_*>_> join;
  list<aiNode_*,_std::allocator<aiNode_*>_> local_138;
  OptimizeGraphProcess *local_120;
  undefined1 local_118 [32];
  undefined8 uStack_f8;
  float local_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  _List_node_base *local_c0;
  undefined1 local_b8 [8];
  float fStack_b0;
  int local_9c;
  undefined1 local_98 [16];
  long ******local_88;
  long ******local_80;
  long local_78;
  key_type local_70;
  _List_node_base *local_50;
  undefined1 local_48 [16];
  
  local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_138;
  local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_138;
  this->nodes_in = this->nodes_in + nd->mNumChildren;
  uStack_d0 = local_d8;
  local_d8 = (undefined1  [8])nodes;
  local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size = 0;
  if (nd->mNumChildren != 0) {
    uVar43 = 0;
    local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&local_138;
    local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)&local_138;
    do {
      CollectNewChildren(this,nd->mChildren[uVar43],&local_138);
      nd->mChildren[uVar43] = (aiNode *)0x0;
      uVar43 = uVar43 + 1;
    } while (uVar43 < nd->mNumChildren);
  }
  pcVar1 = (nd->mName).data;
  local_118._0_8_ = local_118 + 0x10;
  sVar29 = strlen(pcVar1);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,pcVar1,(nd->mName).data + sVar29);
  local_98._0_8_ = &this->locked;
  iVar30 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&(this->locked)._M_t,(key_type *)local_118);
  local_b8 = (undefined1  [8])&(this->locked)._M_t._M_impl.super__Rb_tree_header;
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,CONCAT44(local_118._20_4_,local_118._16_4_) + 1);
  }
  if ((undefined1  [8])iVar30._M_node == local_b8) {
    p_Var31 = (_List_node_base *)&local_138;
    local_120 = this;
    if (local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&local_138) {
      p_Var37 = local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      do {
        p_Var31 = p_Var37[1]._M_next;
        pcVar1 = (char *)((long)&p_Var31->_M_next + 4);
        local_118._0_8_ = local_118 + 0x10;
        sVar29 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,pcVar1,(long)&p_Var31->_M_next + sVar29 + 4);
        iVar34 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_98._0_8_,(key_type *)local_118);
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,CONCAT44(local_118._20_4_,local_118._16_4_) + 1);
        }
        if (iVar34._M_node == iVar30._M_node) {
          p_Var31 = p_Var37[1]._M_next;
          fVar51 = (nd->mTransformation).a1;
          fVar52 = (nd->mTransformation).a2;
          fVar46 = (nd->mTransformation).a3;
          fVar55 = (nd->mTransformation).a4;
          fVar50 = *(float *)((long)&p_Var31[0x40]._M_next + 4);
          fVar53 = *(float *)&p_Var31[0x40]._M_prev;
          fVar58 = *(float *)((long)&p_Var31[0x40]._M_prev + 4);
          fVar6 = *(float *)&p_Var31[0x41]._M_next;
          fVar7 = *(float *)((long)&p_Var31[0x41]._M_next + 4);
          fVar8 = *(float *)&p_Var31[0x41]._M_prev;
          fVar9 = *(float *)((long)&p_Var31[0x41]._M_prev + 4);
          fVar10 = *(float *)&p_Var31[0x42]._M_next;
          fVar11 = *(float *)((long)&p_Var31[0x42]._M_next + 4);
          fVar12 = *(float *)&p_Var31[0x42]._M_prev;
          fVar13 = *(float *)((long)&p_Var31[0x42]._M_prev + 4);
          fVar14 = *(float *)&p_Var31[0x43]._M_next;
          pauVar2 = (undefined1 (*) [16])((long)&p_Var31[0x43]._M_next + 4);
          fVar15 = *(float *)&p_Var31[0x43]._M_prev;
          fVar16 = *(float *)((long)&p_Var31[0x43]._M_prev + 4);
          auVar24 = *(undefined1 (*) [12])*pauVar2;
          fVar17 = *(float *)&p_Var31[0x44]._M_next;
          auVar25 = *pauVar2;
          fVar54 = (nd->mTransformation).b2;
          fVar59 = (nd->mTransformation).b1;
          fVar56 = (nd->mTransformation).b3;
          fVar48 = (nd->mTransformation).b4;
          fVar63 = (nd->mTransformation).c2;
          fVar60 = (nd->mTransformation).c1;
          fVar47 = (nd->mTransformation).c3;
          fVar62 = (nd->mTransformation).c4;
          fVar61 = (nd->mTransformation).d2;
          fVar45 = (nd->mTransformation).d1;
          fVar49 = (nd->mTransformation).d3;
          fVar57 = (nd->mTransformation).d4;
          *(float *)((long)&p_Var31[0x40]._M_next + 4) =
               fVar55 * *(float *)*pauVar2 + fVar46 * fVar11 + fVar51 * fVar50 + fVar52 * fVar7;
          *(float *)&p_Var31[0x40]._M_prev =
               fVar55 * fVar15 + fVar46 * fVar12 + fVar51 * fVar53 + fVar52 * fVar8;
          *(float *)((long)&p_Var31[0x40]._M_prev + 4) =
               fVar55 * fVar16 + fVar46 * fVar13 + fVar51 * fVar58 + fVar52 * fVar9;
          *(float *)&p_Var31[0x41]._M_next =
               fVar55 * fVar17 + fVar46 * fVar14 + fVar51 * fVar6 + fVar52 * fVar10;
          local_b8._0_4_ = auVar24._0_4_;
          local_b8._4_4_ = auVar24._4_4_;
          fStack_b0 = auVar24._8_4_;
          *(float *)((long)&p_Var31[0x41]._M_next + 4) =
               fVar48 * (float)local_b8._0_4_ + fVar56 * fVar11 + fVar59 * fVar50 + fVar54 * fVar7;
          *(float *)&p_Var31[0x41]._M_prev =
               fVar48 * (float)local_b8._4_4_ + fVar56 * fVar12 + fVar59 * fVar53 + fVar54 * fVar8;
          *(float *)((long)&p_Var31[0x41]._M_prev + 4) =
               fVar48 * fStack_b0 + fVar56 * fVar13 + fVar59 * fVar58 + fVar54 * fVar9;
          *(float *)&p_Var31[0x42]._M_next =
               fVar48 * fVar17 + fVar56 * fVar14 + fVar59 * fVar6 + fVar54 * fVar10;
          *(float *)((long)&p_Var31[0x42]._M_next + 4) =
               fVar62 * (float)local_b8._0_4_ + fVar47 * fVar11 + fVar60 * fVar50 + fVar63 * fVar7;
          *(float *)&p_Var31[0x42]._M_prev =
               fVar62 * (float)local_b8._4_4_ + fVar47 * fVar12 + fVar60 * fVar53 + fVar63 * fVar8;
          *(float *)((long)&p_Var31[0x42]._M_prev + 4) =
               fVar62 * fStack_b0 + fVar47 * fVar13 + fVar60 * fVar58 + fVar63 * fVar9;
          *(float *)&p_Var31[0x43]._M_next =
               fVar62 * fVar17 + fVar47 * fVar14 + fVar60 * fVar6 + fVar63 * fVar10;
          *(float *)((long)&p_Var31[0x43]._M_next + 4) =
               fVar57 * (float)local_b8._0_4_ + fVar49 * fVar11 + fVar45 * fVar50 + fVar61 * fVar7;
          *(float *)&p_Var31[0x43]._M_prev =
               fVar57 * (float)local_b8._4_4_ + fVar49 * fVar12 + fVar45 * fVar53 + fVar61 * fVar8;
          *(float *)((long)&p_Var31[0x43]._M_prev + 4) =
               fVar57 * fStack_b0 + fVar49 * fVar13 + fVar45 * fVar58 + fVar61 * fVar9;
          *(float *)&p_Var31[0x44]._M_next =
               fVar57 * fVar17 + fVar49 * fVar14 + fVar45 * fVar6 + fVar61 * fVar10;
          _local_b8 = auVar25;
          p_Var31 = (_List_node_base *)operator_new(0x18);
          p_Var31[1]._M_next = p_Var37[1]._M_next;
          auVar27 = local_d8;
          std::__detail::_List_node_base::_M_hook(p_Var31);
          *(long *)((long)auVar27 + 0x10) = *(long *)((long)auVar27 + 0x10) + 1;
          p_Var38 = p_Var37->_M_next;
          local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
               local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var37,0x18);
        }
        else {
          p_Var38 = p_Var37->_M_next;
        }
        p_Var31 = local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                  super__List_node_base._M_next;
        p_Var37 = p_Var38;
      } while (p_Var38 != (_List_node_base *)&local_138);
    }
    if ((nd->mNumMeshes == 0) && (p_Var31 == (_List_node_base *)&local_138)) {
      aiNode::~aiNode(nd);
      operator_delete(nd,0x478);
      goto LAB_003d575e;
    }
    p_Var31 = (_List_node_base *)operator_new(0x18);
    this = local_120;
    p_Var31[1]._M_next = (_List_node_base *)nd;
    auVar27 = local_d8;
    std::__detail::_List_node_base::_M_hook(p_Var31);
    *(long *)((long)auVar27 + 0x10) = *(long *)((long)auVar27 + 0x10) + 1;
    pcVar26 = (pointer)local_118._0_8_;
  }
  else {
    p_Var31 = (_List_node_base *)operator_new(0x18);
    p_Var31[1]._M_next = (_List_node_base *)nd;
    auVar27 = local_d8;
    std::__detail::_List_node_base::_M_hook(p_Var31);
    *(long *)((long)auVar27 + 0x10) = *(long *)((long)auVar27 + 0x10) + 1;
    local_118._0_4_ = 1.0;
    local_118._4_4_ = 0.0;
    local_118._8_4_ = 0.0;
    local_118._12_4_ = 0.0;
    local_118._16_4_ = 0.0;
    local_118._20_4_ = 1.0;
    local_118._24_8_ = 0;
    uStack_f8._0_4_ = 0.0;
    uStack_f8._4_4_ = 0.0;
    local_f0 = 1.0;
    fStack_ec = 0.0;
    fStack_e8 = 0.0;
    fStack_e4 = 0.0;
    fStack_e0 = 0.0;
    fStack_dc = 1.0;
    local_88 = (long ******)&local_88;
    local_78 = 0;
    local_80 = local_88;
    pcVar26 = (pointer)0x3f800000;
    if (local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&local_138) {
      p_Var37 = (_List_node_base *)0x0;
      p_Var31 = local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      local_120 = this;
      do {
        p_Var38 = p_Var31[1]._M_next;
        if (*(int *)&p_Var38[0x45]._M_next == 0) {
          pcVar1 = (char *)((long)&p_Var38->_M_next + 4);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          sVar29 = strlen(pcVar1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,pcVar1,(long)&p_Var38->_M_next + sVar29 + 4);
          iVar30 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_98._0_8_,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1  [8])iVar30._M_node != local_b8) goto LAB_003d48d8;
          uVar39 = *(uint *)&p_Var38[0x46]._M_next;
          if ((ulong)uVar39 == 0) {
            uVar43 = 0;
LAB_003d4926:
            if ((uint)uVar43 != uVar39) goto LAB_003d48d8;
          }
          else {
            uVar43 = 0;
            do {
              if (1 < (local_120->meshes).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [*(uint *)((long)&(p_Var38[0x46]._M_prev)->_M_next + uVar43 * 4)])
              goto LAB_003d4926;
              uVar43 = uVar43 + 1;
            } while (uVar39 != uVar43);
          }
          if (p_Var37 == (_List_node_base *)0x0) {
            uVar18 = *(undefined8 *)((long)&p_Var38[0x40]._M_next + 4);
            uVar19 = *(undefined8 *)((long)&p_Var38[0x40]._M_prev + 4);
            uVar20 = *(undefined8 *)((long)&p_Var38[0x41]._M_next + 4);
            local_118._24_8_ = *(undefined8 *)((long)&p_Var38[0x41]._M_prev + 4);
            uStack_f8 = *(undefined8 *)((long)&p_Var38[0x42]._M_next + 4);
            uVar21 = *(undefined8 *)((long)&p_Var38[0x42]._M_prev + 4);
            uVar22 = *(undefined8 *)((long)&p_Var38[0x43]._M_next + 4);
            uVar23 = *(undefined8 *)((long)&p_Var38[0x43]._M_prev + 4);
            fStack_e8 = (float)uVar22;
            fStack_e4 = (float)((ulong)uVar22 >> 0x20);
            fStack_e0 = (float)uVar23;
            fStack_dc = (float)((ulong)uVar23 >> 0x20);
            local_f0 = (float)uVar21;
            fStack_ec = (float)((ulong)uVar21 >> 0x20);
            local_118._16_4_ = (undefined4)uVar20;
            local_118._20_4_ = (undefined4)((ulong)uVar20 >> 0x20);
            local_118._0_4_ = (undefined4)uVar18;
            local_118._4_4_ = (undefined4)((ulong)uVar18 >> 0x20);
            local_118._8_4_ = (undefined4)uVar19;
            local_118._12_4_ = (undefined4)((ulong)uVar19 >> 0x20);
            aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_118);
            p_Var37 = p_Var38;
            goto LAB_003d48d8;
          }
          pauVar2 = (undefined1 (*) [16])((long)&p_Var38[0x40]._M_next + 4);
          fVar51 = *(float *)&p_Var38[0x40]._M_prev;
          fVar52 = *(float *)((long)&p_Var38[0x40]._M_prev + 4);
          auVar24 = *(undefined1 (*) [12])*pauVar2;
          fVar46 = *(float *)&p_Var38[0x41]._M_next;
          auVar25 = *pauVar2;
          fVar55 = *(float *)((long)&p_Var38[0x41]._M_next + 4);
          fVar54 = *(float *)&p_Var38[0x41]._M_prev;
          fVar59 = *(float *)((long)&p_Var38[0x41]._M_prev + 4);
          fVar56 = *(float *)&p_Var38[0x42]._M_next;
          fVar48 = *(float *)((long)&p_Var38[0x42]._M_next + 4);
          fVar63 = *(float *)&p_Var38[0x42]._M_prev;
          fVar60 = *(float *)((long)&p_Var38[0x42]._M_prev + 4);
          fVar47 = *(float *)&p_Var38[0x43]._M_next;
          fVar62 = *(float *)((long)&p_Var38[0x43]._M_next + 4);
          fVar61 = *(float *)&p_Var38[0x43]._M_prev;
          fVar45 = *(float *)((long)&p_Var38[0x43]._M_prev + 4);
          fVar49 = *(float *)&p_Var38[0x44]._M_next;
          *(float *)((long)&p_Var38[0x40]._M_next + 4) =
               (float)local_118._12_4_ * fVar62 +
               (float)local_118._8_4_ * fVar48 +
               (float)local_118._0_4_ * *(float *)*pauVar2 + (float)local_118._4_4_ * fVar55;
          *(float *)&p_Var38[0x40]._M_prev =
               (float)local_118._12_4_ * fVar61 +
               (float)local_118._8_4_ * fVar63 +
               (float)local_118._0_4_ * fVar51 + (float)local_118._4_4_ * fVar54;
          *(float *)((long)&p_Var38[0x40]._M_prev + 4) =
               (float)local_118._12_4_ * fVar45 +
               (float)local_118._8_4_ * fVar60 +
               (float)local_118._0_4_ * fVar52 + (float)local_118._4_4_ * fVar59;
          *(float *)&p_Var38[0x41]._M_next =
               (float)local_118._12_4_ * fVar49 +
               (float)local_118._8_4_ * fVar47 +
               (float)local_118._0_4_ * fVar46 + (float)local_118._4_4_ * fVar56;
          local_d8._0_4_ = auVar24._0_4_;
          local_d8._4_4_ = auVar24._4_4_;
          uStack_d0._0_4_ = auVar24._8_4_;
          *(float *)((long)&p_Var38[0x41]._M_next + 4) =
               (float)local_118._28_4_ * fVar62 +
               (float)local_118._24_4_ * fVar48 +
               (float)local_118._16_4_ * (float)local_d8._0_4_ + (float)local_118._20_4_ * fVar55;
          *(float *)&p_Var38[0x41]._M_prev =
               (float)local_118._28_4_ * fVar61 +
               (float)local_118._24_4_ * fVar63 +
               (float)local_118._16_4_ * (float)local_d8._4_4_ + (float)local_118._20_4_ * fVar54;
          *(float *)((long)&p_Var38[0x41]._M_prev + 4) =
               (float)local_118._28_4_ * fVar45 +
               (float)local_118._24_4_ * fVar60 +
               (float)local_118._16_4_ * (float)uStack_d0 + (float)local_118._20_4_ * fVar59;
          *(float *)&p_Var38[0x42]._M_next =
               (float)local_118._28_4_ * fVar49 +
               (float)local_118._24_4_ * fVar47 +
               (float)local_118._16_4_ * fVar46 + (float)local_118._20_4_ * fVar56;
          *(float *)((long)&p_Var38[0x42]._M_next + 4) =
               fStack_ec * fVar62 +
               local_f0 * fVar48 +
               (float)uStack_f8 * (float)local_d8._0_4_ + uStack_f8._4_4_ * fVar55;
          *(float *)&p_Var38[0x42]._M_prev =
               fStack_ec * fVar61 +
               local_f0 * fVar63 +
               (float)uStack_f8 * (float)local_d8._4_4_ + uStack_f8._4_4_ * fVar54;
          *(float *)((long)&p_Var38[0x42]._M_prev + 4) =
               fStack_ec * fVar45 +
               local_f0 * fVar60 + (float)uStack_f8 * (float)uStack_d0 + uStack_f8._4_4_ * fVar59;
          *(float *)&p_Var38[0x43]._M_next =
               fStack_ec * fVar49 +
               local_f0 * fVar47 + (float)uStack_f8 * fVar46 + uStack_f8._4_4_ * fVar56;
          *(float *)((long)&p_Var38[0x43]._M_next + 4) =
               fStack_dc * fVar62 +
               fStack_e0 * fVar48 + fStack_e8 * (float)local_d8._0_4_ + fStack_e4 * fVar55;
          *(float *)&p_Var38[0x43]._M_prev =
               fStack_dc * fVar61 +
               fStack_e0 * fVar63 + fStack_e8 * (float)local_d8._4_4_ + fStack_e4 * fVar54;
          *(float *)((long)&p_Var38[0x43]._M_prev + 4) =
               fStack_dc * fVar45 +
               fStack_e0 * fVar60 + fStack_e8 * (float)uStack_d0 + fStack_e4 * fVar59;
          *(float *)&p_Var38[0x44]._M_next =
               fStack_dc * fVar49 + fStack_e0 * fVar47 + fStack_e8 * fVar46 + fStack_e4 * fVar56;
          _local_d8 = auVar25;
          p_Var32 = (_List_node_base *)operator_new(0x18);
          p_Var32[1]._M_next = p_Var38;
          std::__detail::_List_node_base::_M_hook(p_Var32);
          local_78 = local_78 + 1;
          p_Var38 = p_Var31->_M_next;
          local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
               local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var31,0x18);
        }
        else {
LAB_003d48d8:
          p_Var38 = p_Var31->_M_next;
        }
        this = local_120;
        p_Var31 = p_Var38;
      } while (p_Var38 != (_List_node_base *)&local_138);
      if ((long *******)local_88 != &local_88 && p_Var37 != (_List_node_base *)0x0) {
        local_120->count_merged = local_120->count_merged + 1;
        iVar42 = 0;
        local_c0 = p_Var37;
        iVar28 = snprintf((char *)((long)&p_Var37->_M_next + 4),0x400,"$MergedNode_%i");
        ppppppplVar41 = (long *******)local_88;
        p_Var31 = local_c0;
        *(int *)&local_c0->_M_next = iVar28;
        ppppppplVar33 = (long *******)local_88;
        if ((long *******)local_88 != &local_88) {
          do {
            ppppppplVar3 = (long *******)*ppppppplVar33;
            iVar42 = iVar42 + *(int *)(ppppppplVar33[2] + 0x8c);
            ppppppplVar33 = ppppppplVar3;
          } while (ppppppplVar3 != &local_88);
          if (iVar42 != 0) {
            local_9c = iVar42;
            local_50 = (_List_node_base *)
                       operator_new__((ulong)(uint)(*(int *)&local_c0[0x46]._M_next + iVar42) << 2);
            p_Var37 = local_50;
            if (*(int *)&p_Var31[0x46]._M_next != 0) {
              lVar40 = 0;
              uVar43 = 0;
              do {
                *(undefined4 *)((long)&local_50->_M_next + uVar43 * 4) =
                     *(undefined4 *)((long)&(p_Var31[0x46]._M_prev)->_M_next + uVar43 * 4);
                uVar43 = uVar43 + 1;
                lVar40 = lVar40 + 4;
              } while (uVar43 < *(uint *)&p_Var31[0x46]._M_next);
              p_Var37 = (_List_node_base *)((long)&local_50->_M_next + lVar40);
            }
            if (ppppppplVar41 != &local_88) {
              do {
                paVar4 = (aiNode *)ppppppplVar41[2];
                if (paVar4->mNumMeshes != 0) {
                  uVar43 = 0;
                  do {
                    uVar39 = paVar4->mMeshes[uVar43];
                    *(uint *)&p_Var37->_M_next = uVar39;
                    fVar62 = (paVar4->mTransformation).b2;
                    local_98 = ZEXT416((uint)fVar62);
                    fVar48 = (paVar4->mTransformation).a1;
                    fVar63 = (paVar4->mTransformation).a2;
                    fVar50 = fVar48 * fVar62;
                    fVar57 = (paVar4->mTransformation).c3;
                    fVar51 = (paVar4->mTransformation).d4;
                    fVar52 = (paVar4->mTransformation).c4;
                    fVar46 = (paVar4->mTransformation).d3;
                    fVar61 = (paVar4->mTransformation).b3;
                    _local_b8 = ZEXT416((uint)fVar61);
                    fVar55 = (paVar4->mTransformation).d2;
                    fVar49 = (paVar4->mTransformation).c2;
                    fVar54 = (paVar4->mTransformation).b4;
                    local_48 = ZEXT416((uint)fVar48);
                    fVar53 = fVar61 * fVar63;
                    fVar59 = (paVar4->mTransformation).d1;
                    fVar45 = (paVar4->mTransformation).c1;
                    fVar47 = (paVar4->mTransformation).b1;
                    _local_d8 = ZEXT416((uint)fVar63);
                    fVar60 = (paVar4->mTransformation).a3;
                    fVar58 = fVar47 * fVar60;
                    fVar56 = (paVar4->mTransformation).a4;
                    pMesh = local_120->mScene->mMeshes[uVar39];
                    if (fVar56 * fVar61 * fVar49 * fVar59 +
                        ((fVar62 * fVar56 * fVar45 * fVar46 +
                         ((fVar47 * fVar56 * fVar57 * fVar55 +
                          (((fVar52 * fVar62 * fVar60 * fVar59 +
                            ((fVar49 * fVar58 * fVar51 +
                             ((fVar45 * fVar54 * fVar60 * fVar55 +
                              fVar63 * fVar47 * fVar52 * fVar46 +
                              ((fVar54 * fVar63 * fVar57 * fVar59 +
                               ((fVar53 * fVar45 * fVar51 +
                                (((fVar49 * fVar48 * fVar54 * fVar46 +
                                  ((fVar52 * fVar48 * fVar61 * fVar55 +
                                   (fVar50 * fVar57 * fVar51 - fVar52 * fVar50 * fVar46)) -
                                  fVar48 * fVar61 * fVar49 * fVar51)) -
                                 fVar48 * fVar54 * fVar57 * fVar55) - fVar52 * fVar53 * fVar59)) -
                               fVar45 * fVar54 * fVar63 * fVar46)) -
                              fVar57 * fVar63 * fVar47 * fVar51)) -
                             fVar54 * fVar60 * fVar49 * fVar59)) - fVar52 * fVar58 * fVar55)) -
                           fVar62 * fVar60 * fVar45 * fVar51) - fVar49 * fVar47 * fVar56 * fVar46))
                         - fVar57 * fVar62 * fVar56 * fVar59)) - fVar45 * fVar56 * fVar61 * fVar55)
                        < 0.0) {
                      FlipWindingOrderProcess::ProcessMesh(pMesh);
                      fVar48 = (paVar4->mTransformation).a1;
                      fVar63 = (paVar4->mTransformation).a2;
                      fVar60 = (paVar4->mTransformation).a3;
                      fVar47 = (paVar4->mTransformation).b1;
                      fVar62 = (paVar4->mTransformation).b2;
                      fVar61 = (paVar4->mTransformation).b3;
                      fVar45 = (paVar4->mTransformation).c1;
                      fVar49 = (paVar4->mTransformation).c2;
                      fVar57 = (paVar4->mTransformation).c3;
                      fVar58 = fVar60 * fVar47;
                      fVar50 = fVar48 * fVar62;
                      fVar53 = fVar63 * fVar61;
                    }
                    local_b8._4_4_ = fVar48;
                    local_b8._0_4_ = fVar47;
                    _fStack_b0 = 0;
                    local_d8 = (undefined1  [8])(CONCAT44(fVar63,fVar63) ^ 0x8000000080000000);
                    uStack_d0._0_4_ = -fVar63;
                    uStack_d0._4_4_ = -fVar63;
                    auVar25 = _local_d8;
                    fVar60 = -fVar60;
                    local_98._4_4_ = fVar63;
                    local_98._0_4_ = fVar62;
                    local_98._8_8_ = 0;
                    fVar46 = fVar62 * fVar60 * fVar45 +
                             fVar58 * fVar49 +
                             fVar47 * -fVar63 * fVar57 +
                             fVar53 * fVar45 + (fVar50 * fVar57 - fVar61 * fVar48 * fVar49);
                    fVar59 = NAN;
                    fVar54 = NAN;
                    fVar55 = NAN;
                    fVar51 = NAN;
                    fVar52 = NAN;
                    if ((fVar46 != 0.0) ||
                       (fVar56 = fVar51, fVar50 = fVar52, fVar53 = fVar51, fVar58 = fVar52,
                       NAN(fVar46))) {
                      fVar46 = 1.0 / fVar46;
                      fVar54 = (fVar63 * fVar61 + fVar62 * fVar60) * fVar46;
                      fVar59 = (fVar48 * fVar62 + fVar47 * -fVar63) * fVar46;
                      fVar56 = -fVar46;
                      fVar55 = (fVar61 * fVar48 + fVar60 * fVar47) * fVar56;
                      fVar51 = (fVar62 * fVar57 + fVar49 * -fVar61) * fVar46;
                      fVar52 = (fVar63 * fVar57 + fVar49 * fVar60) * fVar56;
                      fVar53 = (fVar49 * fVar47 + -fVar62 * fVar45) * fVar46;
                      fVar58 = (fVar49 * fVar48 + (float)local_d8._0_4_ * fVar45) * fVar56;
                      fVar56 = fVar56 * (fVar57 * fVar47 + -fVar61 * fVar45);
                      fVar50 = fVar46 * (fVar57 * fVar48 + fVar60 * fVar45);
                    }
                    if (pMesh->mNumVertices != 0) {
                      lVar40 = 8;
                      uVar36 = 0;
                      do {
                        paVar5 = pMesh->mVertices;
                        fVar46 = *(float *)((long)paVar5 + lVar40 + -8);
                        fVar48 = *(float *)((long)paVar5 + lVar40 + -4);
                        fVar63 = *(float *)((long)&paVar5->x + lVar40);
                        fVar60 = (paVar4->mTransformation).c2;
                        fVar47 = (paVar4->mTransformation).c1;
                        fVar62 = (paVar4->mTransformation).c3;
                        fVar61 = (paVar4->mTransformation).c4;
                        *(ulong *)((long)paVar5 + lVar40 + -8) =
                             CONCAT44((paVar4->mTransformation).b4 +
                                      fVar63 * (paVar4->mTransformation).b3 +
                                      fVar46 * (paVar4->mTransformation).b1 +
                                      (paVar4->mTransformation).b2 * fVar48,
                                      (paVar4->mTransformation).a4 +
                                      fVar63 * (paVar4->mTransformation).a3 +
                                      fVar46 * (paVar4->mTransformation).a1 +
                                      (paVar4->mTransformation).a2 * fVar48);
                        *(float *)((long)&paVar5->x + lVar40) =
                             fVar63 * fVar62 + fVar46 * fVar47 + fVar48 * fVar60 + fVar61;
                        paVar5 = pMesh->mNormals;
                        uVar39 = pMesh->mNumVertices;
                        if (uVar39 != 0 && paVar5 != (aiVector3D *)0x0) {
                          fVar46 = *(float *)((long)paVar5 + lVar40 + -8);
                          fVar48 = *(float *)((long)paVar5 + lVar40 + -4);
                          fVar63 = *(float *)((long)&paVar5->x + lVar40);
                          *(ulong *)((long)paVar5 + lVar40 + -8) =
                               CONCAT44(fVar63 * fVar58 + fVar46 * fVar52 + fVar48 * fVar50,
                                        fVar63 * fVar53 + fVar46 * fVar51 + fVar48 * fVar56);
                          *(float *)((long)&paVar5->x + lVar40) =
                               fVar54 * fVar46 + fVar55 * fVar48 + fVar59 * fVar63;
                          uVar39 = pMesh->mNumVertices;
                        }
                        paVar5 = pMesh->mTangents;
                        if ((paVar5 != (aiVector3D *)0x0) &&
                           (pMesh->mBitangents != (aiVector3D *)0x0)) {
                          if (uVar39 == 0) {
                            uVar39 = 0;
                          }
                          else {
                            fVar46 = *(float *)((long)paVar5 + lVar40 + -8);
                            fVar48 = *(float *)((long)paVar5 + lVar40 + -4);
                            fVar63 = *(float *)((long)&paVar5->x + lVar40);
                            *(ulong *)((long)paVar5 + lVar40 + -8) =
                                 CONCAT44(fVar63 * fVar58 + fVar46 * fVar52 + fVar48 * fVar50,
                                          fVar63 * fVar53 + fVar46 * fVar51 + fVar48 * fVar56);
                            *(float *)((long)&paVar5->x + lVar40) =
                                 fVar54 * fVar46 + fVar55 * fVar48 + fVar59 * fVar63;
                            paVar5 = pMesh->mBitangents;
                            fVar46 = *(float *)((long)paVar5 + lVar40 + -8);
                            fVar48 = *(float *)((long)paVar5 + lVar40 + -4);
                            fVar63 = *(float *)((long)&paVar5->x + lVar40);
                            *(ulong *)((long)paVar5 + lVar40 + -8) =
                                 CONCAT44(fVar63 * fVar58 + fVar46 * fVar52 + fVar48 * fVar50,
                                          fVar63 * fVar53 + fVar46 * fVar51 + fVar48 * fVar56);
                            *(float *)((long)&paVar5->x + lVar40) =
                                 fVar54 * fVar46 + fVar55 * fVar48 + fVar59 * fVar63;
                            uVar39 = pMesh->mNumVertices;
                          }
                        }
                        uVar36 = uVar36 + 1;
                        lVar40 = lVar40 + 0xc;
                      } while (uVar36 < uVar39);
                    }
                    p_Var37 = (_List_node_base *)((long)&p_Var37->_M_next + 4);
                    uVar43 = uVar43 + 1;
                    _local_d8 = auVar25;
                  } while (uVar43 < paVar4->mNumMeshes);
                }
                aiNode::~aiNode(paVar4);
                operator_delete(paVar4,0x478);
                ppppppplVar41 = (long *******)*ppppppplVar41;
                p_Var31 = local_c0;
              } while (ppppppplVar41 != &local_88);
            }
            if (p_Var31[0x46]._M_prev != (_List_node_base *)0x0) {
              operator_delete__(p_Var31[0x46]._M_prev);
            }
            local_c0[0x46]._M_prev = local_50;
            *(int *)&local_c0[0x46]._M_next = *(int *)&local_c0[0x46]._M_next + local_9c;
            this = local_120;
          }
        }
      }
      pcVar26 = (pointer)CONCAT44(local_118._4_4_,local_118._0_4_);
      ppppppplVar41 = (long *******)local_88;
      while (ppppppplVar41 != &local_88) {
        ppppppplVar33 = (long *******)*ppppppplVar41;
        operator_delete(ppppppplVar41,0x18);
        pcVar26 = (pointer)CONCAT44(local_118._4_4_,local_118._0_4_);
        ppppppplVar41 = ppppppplVar33;
      }
    }
  }
  if ((local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
       super__List_node_base._M_next == (_List_node_base *)&local_138) ||
     (nd->mNumChildren <
      local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size)) {
    local_118._0_8_ = pcVar26;
    if (nd->mChildren != (aiNode **)0x0) {
      operator_delete__(nd->mChildren);
    }
    sVar44 = local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
    ;
    p_Var31 = local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
              super__List_node_base._M_next;
    if (local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&local_138) {
      ppaVar35 = (aiNode **)
                 operator_new__(-(ulong)(local_138.
                                         super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                         _M_impl._M_node._M_size >> 0x3d != 0) |
                                local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                _M_impl._M_node._M_size * 8);
      nd->mChildren = ppaVar35;
      pcVar26 = (pointer)local_118._0_8_;
      goto LAB_003d5702;
    }
    nd->mChildren = (aiNode **)0x0;
    nd->mNumChildren =
         (uint)local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size;
    uVar39 = (uint)local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                   _M_size;
  }
  else {
    ppaVar35 = nd->mChildren;
    p_Var31 = local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
              super__List_node_base._M_next;
    sVar44 = local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
    ;
LAB_003d5702:
    nd->mNumChildren = (uint)sVar44;
    uVar39 = (uint)sVar44;
    local_118._0_8_ = pcVar26;
    if (p_Var31 != (_List_node_base *)&local_138 && ppaVar35 != (aiNode **)0x0) {
      do {
        paVar4 = (aiNode *)p_Var31[1]._M_next;
        *ppaVar35 = paVar4;
        ppaVar35 = ppaVar35 + 1;
        paVar4->mParent = nd;
        p_Var31 = p_Var31->_M_next;
      } while (p_Var31 != (_List_node_base *)&local_138);
      uVar39 = (uint)local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node
                     ._M_size;
    }
  }
  this->nodes_out = this->nodes_out + uVar39;
LAB_003d575e:
  p_Var31 = local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (local_138.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_138) {
    do {
      p_Var37 = p_Var31->_M_next;
      operator_delete(p_Var31,0x18);
      p_Var31 = p_Var37;
    } while (p_Var37 != (_List_node_base *)&local_138);
  }
  return;
}

Assistant:

void OptimizeGraphProcess::CollectNewChildren(aiNode *nd, std::list<aiNode *> &nodes) {
	nodes_in += nd->mNumChildren;

	// Process children
	std::list<aiNode *> child_nodes;
	for (unsigned int i = 0; i < nd->mNumChildren; ++i) {
		CollectNewChildren(nd->mChildren[i], child_nodes);
		nd->mChildren[i] = nullptr;
	}

	// Check whether we need this node; if not we can replace it by our own children (warn, danger of incest).
	if (locked.find(AI_OG_GETKEY(nd->mName)) == locked.end()) {
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end();) {

			if (locked.find(AI_OG_GETKEY((*it)->mName)) == locked.end()) {
				(*it)->mTransformation = nd->mTransformation * (*it)->mTransformation;
				nodes.push_back(*it);

				it = child_nodes.erase(it);
				continue;
			}
			++it;
		}

		if (nd->mNumMeshes || !child_nodes.empty()) {
			nodes.push_back(nd);
		} else {
			delete nd; /* bye, node */
			return;
		}
	} else {

		// Retain our current position in the hierarchy
		nodes.push_back(nd);

		// Now check for possible optimizations in our list of child nodes. join as many as possible
		aiNode *join_master = nullptr;
		aiMatrix4x4 inv;

		const LockedSetType::const_iterator end = locked.end();

		std::list<aiNode *> join;
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end();) {
			aiNode *child = *it;
			if (child->mNumChildren == 0 && locked.find(AI_OG_GETKEY(child->mName)) == end) {

				// There may be no instanced meshes
				unsigned int n = 0;
				for (; n < child->mNumMeshes; ++n) {
					if (meshes[child->mMeshes[n]] > 1) {
						break;
					}
				}
				if (n == child->mNumMeshes) {
					if (!join_master) {
						join_master = child;
						inv = join_master->mTransformation;
						inv.Inverse();
					} else {
						child->mTransformation = inv * child->mTransformation;

						join.push_back(child);
						it = child_nodes.erase(it);
						continue;
					}
				}
			}
			++it;
		}
		if (join_master && !join.empty()) {
			join_master->mName.length = ::ai_snprintf(join_master->mName.data, MAXLEN, "$MergedNode_%i", count_merged++);

			unsigned int out_meshes = 0;
			for (std::list<aiNode *>::const_iterator it = join.cbegin(); it != join.cend(); ++it) {
				out_meshes += (*it)->mNumMeshes;
			}

			// copy all mesh references in one array
			if (out_meshes) {
				unsigned int *meshes = new unsigned int[out_meshes + join_master->mNumMeshes], *tmp = meshes;
				for (unsigned int n = 0; n < join_master->mNumMeshes; ++n) {
					*tmp++ = join_master->mMeshes[n];
				}

				for (const aiNode *join_node : join) {
					for (unsigned int n = 0; n < join_node->mNumMeshes; ++n) {

						*tmp = join_node->mMeshes[n];
						aiMesh *mesh = mScene->mMeshes[*tmp++];

						// Assume the transformation is affine
						// manually move the mesh into the right coordinate system

						// Check for odd negative scale (mirror)
						if (join_node->mTransformation.Determinant() < 0) {
							// Reverse the mesh face winding order
                            FlipWindingOrderProcess::ProcessMesh(mesh);
						}

                        // Update positions, normals and tangents
						const aiMatrix3x3 IT = aiMatrix3x3(join_node->mTransformation).Inverse().Transpose();
						for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {

							mesh->mVertices[a] *= join_node->mTransformation;

							if (mesh->HasNormals())
								mesh->mNormals[a] *= IT;

							if (mesh->HasTangentsAndBitangents()) {
								mesh->mTangents[a] *= IT;
								mesh->mBitangents[a] *= IT;
							}
						}
					}
					delete join_node; // bye, node
				}
				delete[] join_master->mMeshes;
				join_master->mMeshes = meshes;
				join_master->mNumMeshes += out_meshes;
			}
		}
	}
	// reassign children if something changed
	if (child_nodes.empty() || child_nodes.size() > nd->mNumChildren) {

		delete[] nd->mChildren;

		if (!child_nodes.empty()) {
			nd->mChildren = new aiNode *[child_nodes.size()];
		} else
			nd->mChildren = nullptr;
	}

	nd->mNumChildren = static_cast<unsigned int>(child_nodes.size());

	if (nd->mChildren) {
		aiNode **tmp = nd->mChildren;
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end(); ++it) {
			aiNode *node = *tmp++ = *it;
			node->mParent = nd;
		}
	}

	nodes_out += static_cast<unsigned int>(child_nodes.size());
}